

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_> *
__thiscall
__cxxabiv1::(anonymous_namespace)::
base_name<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
          (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          *s)

{
  char *__s1;
  int iVar1;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *extraout_RAX;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *extraout_RAX_00;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_type __len;
  size_type __size;
  ulong uVar6;
  char *pcVar7;
  
  uVar6 = *(ulong *)(this + 8);
  if (uVar6 == 0) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::basic_string(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)this);
    return extraout_RAX;
  }
  __s1 = *(char **)this;
  sVar4 = 0xb;
  if (uVar6 < 0xb) {
    sVar4 = uVar6;
  }
  iVar1 = bcmp(__s1,"std::string",sVar4);
  if ((uVar6 == 0xb) && (iVar1 == 0)) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                  *)this,0,0xb,
                 "std::basic_string<char, std::char_traits<char>, std::allocator<char> >",0x46);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "basic_string";
    pcVar3 = "";
  }
  else {
    sVar4 = 0xc;
    if (uVar6 < 0xc) {
      sVar4 = uVar6;
    }
    iVar1 = bcmp(__s1,"std::istream",sVar4);
    if ((uVar6 == 0xc) && (iVar1 == 0)) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)this,0,0xc,"std::basic_istream<char, std::char_traits<char> >",0x31);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "basic_istream";
      pcVar3 = "";
    }
    else {
      iVar1 = bcmp(__s1,"std::ostream",sVar4);
      if ((uVar6 == 0xc) && (iVar1 == 0)) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                      *)this,0,0xc,"std::basic_ostream<char, std::char_traits<char> >",0x31);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "basic_ostream";
        pcVar3 = "";
      }
      else {
        sVar4 = 0xd;
        if (uVar6 < 0xd) {
          sVar4 = uVar6;
        }
        iVar1 = bcmp(__s1,"std::iostream",sVar4);
        if ((uVar6 == 0xd) && (iVar1 == 0)) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                        *)this,0,0xd,"std::basic_iostream<char, std::char_traits<char> >",0x32);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar5 = "basic_iostream";
          pcVar3 = "";
        }
        else {
          if (__s1[uVar6 - 1] == '>') {
            if (__s1 + (uVar6 - 1) != __s1) {
              iVar1 = 1;
              do {
                if (__s1[uVar6 - 2] == '>') {
                  iVar1 = iVar1 + 1;
                }
                else if ((__s1[uVar6 - 2] == '<') && (iVar1 = iVar1 + -1, iVar1 == 0)) {
                  pcVar7 = __s1 + (uVar6 - 2);
                  pcVar3 = pcVar7;
                  goto LAB_001b30f7;
                }
                uVar6 = uVar6 - 1;
              } while (uVar6 != 1);
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            return (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)&__return_storage_ptr__->field_2;
          }
          pcVar7 = __s1 + uVar6;
          pcVar3 = pcVar7;
LAB_001b30f7:
          do {
            pcVar2 = pcVar7 + -1;
            pcVar5 = __s1;
            if (pcVar2 == __s1) break;
            pcVar5 = pcVar7;
            pcVar7 = pcVar2;
          } while (*pcVar2 != ':');
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        }
      }
    }
  }
  std::__cxx11::
  basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
              *)__return_storage_ptr__,pcVar5,pcVar3);
  return extraout_RAX_00;
}

Assistant:

String
base_name(String& s)
{
    if (s.empty())
        return s;
    if (s == "std::string")
    {
        s = "std::basic_string<char, std::char_traits<char>, std::allocator<char> >";
        return "basic_string";
    }
    if (s == "std::istream")
    {
        s = "std::basic_istream<char, std::char_traits<char> >";
        return "basic_istream";
    }
    if (s == "std::ostream")
    {
        s = "std::basic_ostream<char, std::char_traits<char> >";
        return "basic_ostream";
    }
    if (s == "std::iostream")
    {
        s = "std::basic_iostream<char, std::char_traits<char> >";
        return "basic_iostream";
    }
    const char* const pf = s.data();
    const char* pe = pf + s.size();
    if (pe[-1] == '>')
    {
        unsigned c = 1;
        while (true)
        {
            if (--pe == pf)
                return String();
            if (pe[-1] == '<')
            {
                if (--c == 0)
                {
                    --pe;
                    break;
                }
            }
            else if (pe[-1] == '>')
                ++c;
        }
    }
    const char* p0 = pe - 1;
    for (; p0 != pf; --p0)
    {
        if (*p0 == ':')
        {
            ++p0;
            break;
        }
    }
    return String(p0, pe);
}